

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void estimateIndexWidth(Index *pIdx)

{
  LogEst LVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = 0;
  for (uVar2 = 0; pIdx->nColumn != uVar2; uVar2 = uVar2 + 1) {
    uVar4 = 1;
    if (-1 < (long)pIdx->aiColumn[uVar2]) {
      uVar4 = (uint)pIdx->pTable->aCol[pIdx->aiColumn[uVar2]].szEst;
    }
    iVar3 = iVar3 + uVar4;
  }
  LVar1 = sqlite3LogEst((ulong)(uint)(iVar3 << 2));
  pIdx->szIdxRow = LVar1;
  return;
}

Assistant:

static void estimateIndexWidth(Index *pIdx){
  unsigned wIndex = 0;
  int i;
  const Column *aCol = pIdx->pTable->aCol;
  for(i=0; i<pIdx->nColumn; i++){
    i16 x = pIdx->aiColumn[i];
    assert( x<pIdx->pTable->nCol );
    wIndex += x<0 ? 1 : aCol[x].szEst;
  }
  pIdx->szIdxRow = sqlite3LogEst(wIndex*4);
}